

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_do_property(nk_flags *ws,nk_command_buffer *out,nk_rect property,char *name,
                   nk_property_variant *variant,float inc_per_pixel,char *buffer,int *len,int *state
                   ,int *cursor,int *select_begin,int *select_end,nk_style_property *style,
                   nk_property_filter filter,nk_input *in,nk_user_font *font,nk_text_edit *text_edit
                   ,nk_button_behavior behavior)

{
  nk_property_kind nVar1;
  nk_rect empty_00;
  nk_rect edit_00;
  nk_rect bounds;
  nk_rect label_00;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect property_00;
  int iVar2;
  int iVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  nk_property local_228;
  nk_property local_220;
  double local_218;
  int local_20c;
  int local_208;
  float local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  nk_input *local_1f0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  nk_property local_198;
  nk_property local_190;
  double local_188;
  float local_17c;
  float local_178;
  float local_174;
  int local_170;
  int local_16c;
  int local_168;
  nk_property local_160;
  nk_property local_158;
  double local_150;
  float local_144;
  float local_140;
  float local_13c;
  int local_138;
  int local_134;
  int local_130;
  float local_128;
  nk_rect empty;
  nk_rect edit;
  nk_rect label;
  nk_rect right;
  nk_rect left;
  int *length;
  char *dst;
  int local_b8;
  float size;
  char string [64];
  int name_len;
  int num_len;
  int old;
  int active;
  nk_plugin_filter filters [2];
  int *len_local;
  char *buffer_local;
  float inc_per_pixel_local;
  nk_property_variant *variant_local;
  char *name_local;
  nk_command_buffer *out_local;
  nk_flags *ws_local;
  nk_rect property_local;
  
  ws_local._0_4_ = property.x;
  ws_local._4_4_ = property.y;
  property_local.x = property.w;
  property_local.y = property.h;
  _old = nk_filter_decimal;
  filters[0] = nk_filter_float;
  fVar5 = font->height / 2.0;
  fVar6 = ws_local._0_4_ + style->border + (style->padding).x;
  fVar7 = (ws_local._4_4_ + style->border + property_local.y / 2.0) - fVar5 / 2.0;
  string._56_4_ = nk_strlen(name);
  fVar8 = (*font->width)(font->userdata,font->height,name,string._56_4_);
  edit.w = fVar6 + fVar5 + (style->padding).x;
  fVar9 = (style->padding).x;
  fVar8 = fVar9 + fVar9 + fVar8;
  edit.h = ws_local._4_4_ + style->border + (style->padding).y;
  fVar9 = property_local.y - (style->border + style->border + (style->padding).y * 2.0);
  fVar10 = (ws_local._0_4_ + property_local.x) - (fVar5 + (style->padding).x);
  if (*state == 1) {
    fVar11 = (*font->width)(font->userdata,font->height,buffer,*len);
    dst._4_4_ = (style->edit).cursor_size + fVar11;
    left._8_8_ = len;
    length = (int *)buffer;
  }
  else {
    nVar1 = variant->kind;
    if (nVar1 == NK_PROPERTY_INT) {
      nk_itoa((char *)&local_b8,(long)(variant->value).i);
      string._60_4_ = nk_strlen((char *)&local_b8);
    }
    else if (nVar1 == NK_PROPERTY_FLOAT) {
      nk_dtoa((char *)&local_b8,(double)(variant->value).f);
      string._60_4_ = nk_string_float_limit((char *)&local_b8,2);
    }
    else if (nVar1 == NK_PROPERTY_DOUBLE) {
      nk_dtoa((char *)&local_b8,(variant->value).d);
      string._60_4_ = nk_string_float_limit((char *)&local_b8,2);
    }
    dst._4_4_ = (*font->width)(font->userdata,font->height,(char *)&local_b8,string._60_4_);
    length = &local_b8;
    left._8_8_ = string + 0x3c;
  }
  fVar11 = (style->padding).x;
  local_128 = fVar11 + fVar11 + dst._4_4_;
  if (fVar10 - (edit.w + fVar8) <= local_128) {
    local_128 = fVar10 - (edit.w + fVar8);
  }
  edit.x = local_128;
  fVar11 = fVar10 - (local_128 + (style->padding).x);
  fVar12 = ws_local._4_4_ + style->border;
  edit.y = property_local.y - (style->border + style->border);
  iVar3 = *state;
  property_00.y = ws_local._4_4_;
  property_00.x = ws_local._0_4_;
  property_00.w = property_local.x;
  property_00.h = property_local.y;
  label_00.y = edit.h;
  label_00.x = edit.w;
  label_00.w = fVar8;
  label_00.h = fVar9;
  edit_00.y = fVar12;
  edit_00.x = fVar11;
  edit_00.w = local_128;
  edit_00.h = edit.y;
  empty_00.y = ws_local._4_4_;
  empty_00.x = edit.w + fVar8;
  empty_00.w = fVar11 - (edit.w + fVar8);
  empty_00.h = property_local.y;
  nk_property_behavior(ws,in,property_00,label_00,edit_00,empty_00,state,variant,inc_per_pixel);
  if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
  }
  nk_draw_property(out,style,(nk_rect *)&ws_local,(nk_rect *)&edit.w,*ws,name,string._56_4_,font);
  if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
  }
  bounds_01.y = fVar7;
  bounds_01.x = fVar6;
  bounds_01.w = fVar5;
  bounds_01.h = fVar5;
  iVar2 = nk_do_button_symbol(ws,out,bounds_01,style->sym_left,behavior,&style->dec_button,in,font);
  if (iVar2 != 0) {
    nVar1 = variant->kind;
    if (nVar1 == NK_PROPERTY_INT) {
      if ((variant->value).i - (variant->step).i < (variant->max_value).i) {
        local_130 = (variant->value).i - (variant->step).i;
      }
      else {
        local_130 = (variant->max_value).i;
      }
      if (local_130 < (variant->min_value).i) {
        local_134 = (variant->min_value).i;
      }
      else {
        if ((variant->value).i - (variant->step).i < (variant->max_value).i) {
          local_138 = (variant->value).i - (variant->step).i;
        }
        else {
          local_138 = (variant->max_value).i;
        }
        local_134 = local_138;
      }
      (variant->value).i = local_134;
    }
    else if (nVar1 == NK_PROPERTY_FLOAT) {
      if ((variant->max_value).f <= (variant->value).f - (variant->step).f) {
        local_13c = (variant->max_value).f;
      }
      else {
        local_13c = (variant->value).f - (variant->step).f;
      }
      if ((variant->min_value).f <= local_13c) {
        if ((variant->max_value).f <= (variant->value).f - (variant->step).f) {
          local_144 = (float)(variant->max_value).i;
        }
        else {
          local_144 = (variant->value).f - (variant->step).f;
        }
        local_140 = local_144;
      }
      else {
        local_140 = (float)(variant->min_value).i;
      }
      (variant->value).i = (int)local_140;
    }
    else if (nVar1 == NK_PROPERTY_DOUBLE) {
      if ((variant->max_value).d <= (variant->value).d - (variant->step).d) {
        local_150 = (variant->max_value).d;
      }
      else {
        local_150 = (variant->value).d - (variant->step).d;
      }
      if ((variant->min_value).d <= local_150) {
        if ((variant->max_value).d <= (variant->value).d - (variant->step).d) {
          local_160 = variant->max_value;
        }
        else {
          local_160.d = (variant->value).d - (variant->step).d;
        }
        local_158.d = local_160.d;
      }
      else {
        local_158 = variant->min_value;
      }
      variant->value = local_158;
    }
  }
  bounds_00.y = fVar7;
  bounds_00.x = fVar10;
  bounds_00.w = fVar5;
  bounds_00.h = fVar5;
  iVar2 = nk_do_button_symbol(ws,out,bounds_00,style->sym_right,behavior,&style->inc_button,in,font)
  ;
  if (iVar2 != 0) {
    nVar1 = variant->kind;
    if (nVar1 == NK_PROPERTY_INT) {
      if ((variant->value).i + (variant->step).i < (variant->max_value).i) {
        local_168 = (variant->value).i + (variant->step).i;
      }
      else {
        local_168 = (variant->max_value).i;
      }
      if (local_168 < (variant->min_value).i) {
        local_16c = (variant->min_value).i;
      }
      else {
        if ((variant->value).i + (variant->step).i < (variant->max_value).i) {
          local_170 = (variant->value).i + (variant->step).i;
        }
        else {
          local_170 = (variant->max_value).i;
        }
        local_16c = local_170;
      }
      (variant->value).i = local_16c;
    }
    else if (nVar1 == NK_PROPERTY_FLOAT) {
      if ((variant->max_value).f <= (variant->value).f + (variant->step).f) {
        local_174 = (variant->max_value).f;
      }
      else {
        local_174 = (variant->value).f + (variant->step).f;
      }
      if ((variant->min_value).f <= local_174) {
        if ((variant->max_value).f <= (variant->value).f + (variant->step).f) {
          local_17c = (float)(variant->max_value).i;
        }
        else {
          local_17c = (variant->value).f + (variant->step).f;
        }
        local_178 = local_17c;
      }
      else {
        local_178 = (float)(variant->min_value).i;
      }
      (variant->value).i = (int)local_178;
    }
    else if (nVar1 == NK_PROPERTY_DOUBLE) {
      if ((variant->max_value).d <= (variant->value).d + (variant->step).d) {
        local_188 = (variant->max_value).d;
      }
      else {
        local_188 = (variant->value).d + (variant->step).d;
      }
      if ((variant->min_value).d <= local_188) {
        if ((variant->max_value).d <= (variant->value).d + (variant->step).d) {
          local_198 = variant->max_value;
        }
        else {
          local_198.d = (variant->value).d + (variant->step).d;
        }
        local_190.d = local_198.d;
      }
      else {
        local_190 = variant->min_value;
      }
      variant->value = local_190;
    }
  }
  if ((iVar3 == 1) || (*state != 1)) {
    bVar4 = *state == 1;
  }
  else {
    nk_memcopy(buffer,length,(long)*(int *)left._8_8_);
    iVar3 = nk_utf_len(buffer,*(int *)left._8_8_);
    *cursor = iVar3;
    *len = *(int *)left._8_8_;
    bVar4 = false;
    left._8_8_ = len;
    length = (int *)buffer;
  }
  nk_textedit_clear_state
            (text_edit,NK_TEXT_EDIT_SINGLE_LINE,*(nk_plugin_filter *)(&old + (ulong)filter * 2));
  text_edit->active = bVar4;
  (text_edit->string).len = *(int *)left._8_8_;
  if (*cursor < *(int *)left._8_8_) {
    local_19c = *cursor;
  }
  else {
    local_19c = *(int *)left._8_8_;
  }
  if (local_19c < 0) {
    local_1a0 = 0;
  }
  else {
    if (*cursor < *(int *)left._8_8_) {
      local_1a4 = *cursor;
    }
    else {
      local_1a4 = *(int *)left._8_8_;
    }
    local_1a0 = local_1a4;
  }
  text_edit->cursor = local_1a0;
  if (*select_begin < *(int *)left._8_8_) {
    local_1a8 = *select_begin;
  }
  else {
    local_1a8 = *(int *)left._8_8_;
  }
  if (local_1a8 < 0) {
    local_1ac = 0;
  }
  else {
    if (*select_begin < *(int *)left._8_8_) {
      local_1b0 = *select_begin;
    }
    else {
      local_1b0 = *(int *)left._8_8_;
    }
    local_1ac = local_1b0;
  }
  text_edit->select_start = local_1ac;
  if (*select_end < *(int *)left._8_8_) {
    local_1b4 = *select_end;
  }
  else {
    local_1b4 = *(int *)left._8_8_;
  }
  if (local_1b4 < 0) {
    local_1b8 = 0;
  }
  else {
    if (*select_end < *(int *)left._8_8_) {
      local_1bc = *select_end;
    }
    else {
      local_1bc = *(int *)left._8_8_;
    }
    local_1b8 = local_1bc;
  }
  text_edit->select_end = local_1b8;
  (text_edit->string).buffer.allocated = (long)*(int *)left._8_8_;
  (text_edit->string).buffer.memory.size = 0x40;
  (text_edit->string).buffer.memory.ptr = length;
  (text_edit->string).buffer.size = 0x40;
  text_edit->mode = '\x01';
  if (*state == 1) {
    local_1f0 = in;
  }
  else {
    local_1f0 = (nk_input *)0x0;
  }
  bounds.y = fVar12;
  bounds.x = fVar11;
  bounds.w = edit.x;
  bounds.h = edit.y;
  nk_do_edit(ws,out,bounds,0x262,*(nk_plugin_filter *)(&old + (ulong)filter * 2),text_edit,
             &style->edit,local_1f0,font);
  *(int *)left._8_8_ = (text_edit->string).len;
  *cursor = text_edit->cursor;
  *select_begin = text_edit->select_start;
  *select_end = text_edit->select_end;
  if ((text_edit->active != '\0') && (iVar3 = nk_input_is_key_pressed(in,NK_KEY_ENTER), iVar3 != 0))
  {
    text_edit->active = '\0';
  }
  if ((bVar4) && (text_edit->active == '\0')) {
    *state = 0;
    buffer[*len] = '\0';
    nVar1 = variant->kind;
    if (nVar1 == NK_PROPERTY_INT) {
      iVar3 = nk_strtoi(buffer,(char **)0x0);
      (variant->value).i = iVar3;
      if ((variant->value).i < (variant->max_value).i) {
        local_1f8 = (variant->value).i;
      }
      else {
        local_1f8 = (variant->max_value).i;
      }
      if (local_1f8 < (variant->min_value).i) {
        local_1fc = (variant->min_value).i;
      }
      else {
        if ((variant->value).i < (variant->max_value).i) {
          local_200 = (variant->value).i;
        }
        else {
          local_200 = (variant->max_value).i;
        }
        local_1fc = local_200;
      }
      (variant->value).i = local_1fc;
    }
    else if (nVar1 == NK_PROPERTY_FLOAT) {
      nk_string_float_limit(buffer,2);
      fVar9 = nk_strtof(buffer,(char **)0x0);
      (variant->value).f = fVar9;
      if ((variant->max_value).f <= (variant->value).f) {
        local_204 = (variant->max_value).f;
      }
      else {
        local_204 = (variant->value).f;
      }
      if ((variant->min_value).f <= local_204) {
        if ((variant->max_value).f <= (variant->value).f) {
          local_20c = (variant->max_value).i;
        }
        else {
          local_20c = (variant->value).i;
        }
        local_208 = local_20c;
      }
      else {
        local_208 = (variant->min_value).i;
      }
      (variant->value).i = local_208;
    }
    else if (nVar1 == NK_PROPERTY_DOUBLE) {
      nk_string_float_limit(buffer,2);
      dVar13 = nk_strtod(buffer,(char **)0x0);
      (variant->value).d = dVar13;
      if ((variant->max_value).d <= (variant->value).d) {
        local_218 = (variant->max_value).d;
      }
      else {
        local_218 = (variant->value).d;
      }
      if ((variant->min_value).d <= local_218) {
        if ((variant->max_value).d <= (variant->value).d) {
          local_228 = variant->max_value;
        }
        else {
          local_228 = variant->value;
        }
        local_220 = local_228;
      }
      else {
        local_220 = variant->min_value;
      }
      variant->value = local_220;
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_do_property(nk_flags *ws,
    struct nk_command_buffer *out, struct nk_rect property,
    const char *name, struct nk_property_variant *variant,
    float inc_per_pixel, char *buffer, int *len,
    int *state, int *cursor, int *select_begin, int *select_end,
    const struct nk_style_property *style,
    enum nk_property_filter filter, struct nk_input *in,
    const struct nk_user_font *font, struct nk_text_edit *text_edit,
    enum nk_button_behavior behavior)
{
    const nk_plugin_filter filters[] = {
        nk_filter_decimal,
        nk_filter_float
    };
    int active, old;
    int num_len, name_len;
    char string[NK_MAX_NUMBER_BUFFER];
    float size;

    char *dst = 0;
    int *length;

    struct nk_rect left;
    struct nk_rect right;
    struct nk_rect label;
    struct nk_rect edit;
    struct nk_rect empty;

    /* left decrement button */
    left.h = font->height/2;
    left.w = left.h;
    left.x = property.x + style->border + style->padding.x;
    left.y = property.y + style->border + property.h/2.0f - left.h/2;

    /* text label */
    name_len = nk_strlen(name);
    size = font->width(font->userdata, font->height, name, name_len);
    label.x = left.x + left.w + style->padding.x;
    label.w = (float)size + 2 * style->padding.x;
    label.y = property.y + style->border + style->padding.y;
    label.h = property.h - (2 * style->border + 2 * style->padding.y);

    /* right increment button */
    right.y = left.y;
    right.w = left.w;
    right.h = left.h;
    right.x = property.x + property.w - (right.w + style->padding.x);

    /* edit */
    if (*state == NK_PROPERTY_EDIT) {
        size = font->width(font->userdata, font->height, buffer, *len);
        size += style->edit.cursor_size;
        length = len;
        dst = buffer;
    } else {
        switch (variant->kind) {
        default: break;
        case NK_PROPERTY_INT:
            nk_itoa(string, variant->value.i);
            num_len = nk_strlen(string);
            break;
        case NK_PROPERTY_FLOAT:
            NK_DTOA(string, (double)variant->value.f);
            num_len = nk_string_float_limit(string, NK_MAX_FLOAT_PRECISION);
            break;
        case NK_PROPERTY_DOUBLE:
            NK_DTOA(string, variant->value.d);
            num_len = nk_string_float_limit(string, NK_MAX_FLOAT_PRECISION);
            break;
        }
        size = font->width(font->userdata, font->height, string, num_len);
        dst = string;
        length = &num_len;
    }

    edit.w =  (float)size + 2 * style->padding.x;
    edit.w = NK_MIN(edit.w, right.x - (label.x + label.w));
    edit.x = right.x - (edit.w + style->padding.x);
    edit.y = property.y + style->border;
    edit.h = property.h - (2 * style->border);

    /* empty left space activator */
    empty.w = edit.x - (label.x + label.w);
    empty.x = label.x + label.w;
    empty.y = property.y;
    empty.h = property.h;

    /* update property */
    old = (*state == NK_PROPERTY_EDIT);
    nk_property_behavior(ws, in, property, label, edit, empty, state, variant, inc_per_pixel);

    /* draw property */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_property(out, style, &property, &label, *ws, name, name_len, font);
    if (style->draw_end) style->draw_end(out, style->userdata);

    /* execute right button  */
    if (nk_do_button_symbol(ws, out, left, style->sym_left, behavior, &style->dec_button, in, font)) {
        switch (variant->kind) {
        default: break;
        case NK_PROPERTY_INT:
            variant->value.i = NK_CLAMP(variant->min_value.i, variant->value.i - variant->step.i, variant->max_value.i); break;
        case NK_PROPERTY_FLOAT:
            variant->value.f = NK_CLAMP(variant->min_value.f, variant->value.f - variant->step.f, variant->max_value.f); break;
        case NK_PROPERTY_DOUBLE:
            variant->value.d = NK_CLAMP(variant->min_value.d, variant->value.d - variant->step.d, variant->max_value.d); break;
        }
    }
    /* execute left button  */
    if (nk_do_button_symbol(ws, out, right, style->sym_right, behavior, &style->inc_button, in, font)) {
        switch (variant->kind) {
        default: break;
        case NK_PROPERTY_INT:
            variant->value.i = NK_CLAMP(variant->min_value.i, variant->value.i + variant->step.i, variant->max_value.i); break;
        case NK_PROPERTY_FLOAT:
            variant->value.f = NK_CLAMP(variant->min_value.f, variant->value.f + variant->step.f, variant->max_value.f); break;
        case NK_PROPERTY_DOUBLE:
            variant->value.d = NK_CLAMP(variant->min_value.d, variant->value.d + variant->step.d, variant->max_value.d); break;
        }
    }
    if (old != NK_PROPERTY_EDIT && (*state == NK_PROPERTY_EDIT)) {
        /* property has been activated so setup buffer */
        NK_MEMCPY(buffer, dst, (nk_size)*length);
        *cursor = nk_utf_len(buffer, *length);
        *len = *length;
        length = len;
        dst = buffer;
        active = 0;
    } else active = (*state == NK_PROPERTY_EDIT);

    /* execute and run text edit field */
    nk_textedit_clear_state(text_edit, NK_TEXT_EDIT_SINGLE_LINE, filters[filter]);
    text_edit->active = (unsigned char)active;
    text_edit->string.len = *length;
    text_edit->cursor = NK_CLAMP(0, *cursor, *length);
    text_edit->select_start = NK_CLAMP(0,*select_begin, *length);
    text_edit->select_end = NK_CLAMP(0,*select_end, *length);
    text_edit->string.buffer.allocated = (nk_size)*length;
    text_edit->string.buffer.memory.size = NK_MAX_NUMBER_BUFFER;
    text_edit->string.buffer.memory.ptr = dst;
    text_edit->string.buffer.size = NK_MAX_NUMBER_BUFFER;
    text_edit->mode = NK_TEXT_EDIT_MODE_INSERT;
    nk_do_edit(ws, out, edit, NK_EDIT_FIELD|NK_EDIT_AUTO_SELECT,
        filters[filter], text_edit, &style->edit, (*state == NK_PROPERTY_EDIT) ? in: 0, font);

    *length = text_edit->string.len;
    *cursor = text_edit->cursor;
    *select_begin = text_edit->select_start;
    *select_end = text_edit->select_end;
    if (text_edit->active && nk_input_is_key_pressed(in, NK_KEY_ENTER))
        text_edit->active = nk_false;

    if (active && !text_edit->active) {
        /* property is now not active so convert edit text to value*/
        *state = NK_PROPERTY_DEFAULT;
        buffer[*len] = '\0';
        switch (variant->kind) {
        default: break;
        case NK_PROPERTY_INT:
            variant->value.i = nk_strtoi(buffer, 0);
            variant->value.i = NK_CLAMP(variant->min_value.i, variant->value.i, variant->max_value.i);
            break;
        case NK_PROPERTY_FLOAT:
            nk_string_float_limit(buffer, NK_MAX_FLOAT_PRECISION);
            variant->value.f = nk_strtof(buffer, 0);
            variant->value.f = NK_CLAMP(variant->min_value.f, variant->value.f, variant->max_value.f);
            break;
        case NK_PROPERTY_DOUBLE:
            nk_string_float_limit(buffer, NK_MAX_FLOAT_PRECISION);
            variant->value.d = nk_strtod(buffer, 0);
            variant->value.d = NK_CLAMP(variant->min_value.d, variant->value.d, variant->max_value.d);
            break;
        }
    }
}